

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall t_dart_generator::generate_dart_pubspec(t_dart_generator *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  reference pbVar5;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_00;
  reference pptVar6;
  int __oflag;
  int __fd;
  undefined1 local_288 [8];
  string include_name;
  t_program *include;
  const_iterator __end1;
  const_iterator __begin1;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range1;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string local_200 [48];
  undefined1 local_1d0 [8];
  ofstream_with_content_based_conditional_update f_pubspec;
  string f_pubspec_name;
  t_dart_generator *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &f_pubspec.field_0x198,&this->base_dir_,"/pubspec.yaml");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_200,pcVar2,
             (allocator *)
             ((long)&lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,(char *)local_200,__oflag);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&lines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"name: ");
  poVar3 = std::operator<<(poVar3,(string *)&this->library_name_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"version: 0.0.1");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"description: Autogenerated by Thrift Compiler");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)local_1d0,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"environment:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"sdk: \'>=1.24.3 <3.0.0\'");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  std::operator<<((ostream *)local_1d0,(string *)&::endl_abi_cxx11_);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
  poVar3 = std::operator<<(poVar3,"dependencies:");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range2,this,&this->pubspec_lib_,'|');
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
    line = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&line);
      if (!bVar1) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
      poVar3 = std::operator<<(poVar3,(string *)pbVar5);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    poVar3 = std::operator<<(poVar3,"thrift:  # ^");
    poVar3 = std::operator<<(poVar3,(string *)&dart_thrift_version_abi_cxx11_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    poVar3 = std::operator<<(poVar3,"path: ../../../../lib/dart");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
  }
  this_00 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
  __end1 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_00);
  include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                *)&include);
    if (!bVar1) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
              ::operator*(&__end1);
    include_name.field_2._8_8_ = *pptVar6;
    find_library_name_abi_cxx11_((string *)local_288,this,(t_program *)include_name.field_2._8_8_);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    poVar3 = std::operator<<(poVar3,(string *)local_288);
    poVar3 = std::operator<<(poVar3,":");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)local_1d0);
    poVar3 = std::operator<<(poVar3,"path: ../");
    poVar3 = std::operator<<(poVar3,(string *)local_288);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    std::__cxx11::string::~string((string *)local_288);
    __gnu_cxx::
    __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>::
    operator++(&__end1);
  }
  t_generator::indent_down((t_generator *)this);
  __fd = 0x56b838;
  std::operator<<((ostream *)local_1d0,(string *)&::endl_abi_cxx11_);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0,__fd);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_1d0);
  std::__cxx11::string::~string((string *)&f_pubspec.field_0x198);
  return;
}

Assistant:

void t_dart_generator::generate_dart_pubspec() {
  string f_pubspec_name = base_dir_ + "/pubspec.yaml";
  ofstream_with_content_based_conditional_update f_pubspec;
  f_pubspec.open(f_pubspec_name.c_str());

  indent(f_pubspec) << "name: " << library_name_ << endl;
  indent(f_pubspec) << "version: 0.0.1" << endl;
  indent(f_pubspec) << "description: Autogenerated by Thrift Compiler" << endl;
  f_pubspec << endl;

  indent(f_pubspec) << "environment:" << endl;
  indent_up();
  indent(f_pubspec) << "sdk: '>=1.24.3 <3.0.0'" << endl;
  indent_down();
  f_pubspec << endl;

  indent(f_pubspec) << "dependencies:" << endl;
  indent_up();

  if (pubspec_lib_.empty()) {
    // default to relative path within working directory, which works for tests
    indent(f_pubspec) << "thrift:  # ^" << dart_thrift_version << endl;
    indent_up();
    indent(f_pubspec) << "path: ../../../../lib/dart" << endl;
    indent_down();
  } else {
    const vector<std::string> lines = split(pubspec_lib_, '|');
    for (const auto & line : lines) {
      indent(f_pubspec) << line << endl;
    }
  }

  // add included thrift files as dependencies
  const vector<t_program*>& includes = program_->get_includes();
  for (auto include : includes) {
    string include_name = find_library_name(include);
    indent(f_pubspec) << include_name << ":" << endl;
    indent_up();
    indent(f_pubspec) << "path: ../" << include_name << endl;
    indent_down();
  }

  indent_down();
  f_pubspec << endl;

  f_pubspec.close();
}